

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STLedgerEntry.cpp
# Opt level: O1

Value __thiscall jbcoin::STLedgerEntry::getJson(STLedgerEntry *this,int options)

{
  ValueHolder VVar1;
  ushort uVar2;
  undefined4 extraout_var;
  ValueHolder *pVVar3;
  int in_ECX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar4;
  undefined4 in_register_00000034;
  ushort uVar5;
  Value VVar6;
  ValueHolder local_40;
  ushort local_38;
  string local_30;
  
  STObject::getJson(&this->super_STObject,options);
  strHex<unsigned_char_const*>
            (&local_30,(jbcoin *)(CONCAT44(in_register_00000034,options) + 0x30),&DAT_00000020,
             in_ECX);
  uVar5 = local_38 & 0xfe00;
  local_38 = uVar5 + 0x104;
  Json::valueAllocator();
  local_40._0_4_ =
       (*Json::valueAllocator::valueAllocator->_vptr_ValueAllocator[4])
                 (Json::valueAllocator::valueAllocator,local_30._M_dataplus._M_p,
                  (ulong)(uint)local_30._M_string_length);
  local_40._4_4_ = extraout_var;
  pVVar3 = &Json::Value::resolveReference((Value *)this,"index",true)->value_;
  VVar1 = *pVVar3;
  *pVVar3 = local_40;
  uVar2 = *(ushort *)(pVVar3 + 1);
  pVVar3[1].bool_ = true;
  *(ushort *)(pVVar3 + 1) = uVar2 & 0xff04 | 0x104;
  local_38 = uVar2 & 0x100 | uVar5 | uVar2 & 0xff;
  local_40 = VVar1;
  Json::Value::~Value((Value *)&local_40);
  uVar4 = extraout_RDX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    uVar4 = extraout_RDX_00;
  }
  VVar6._8_8_ = uVar4;
  VVar6.value_.map_ = (ObjectValues *)this;
  return VVar6;
}

Assistant:

Json::Value STLedgerEntry::getJson (int options) const
{
    Json::Value ret (STObject::getJson (options));

    ret[jss::index] = to_string (key_);

    return ret;
}